

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_math.cxx
# Opt level: O1

void ndiAnglesFromMatrixf(float *outRotationAngles,float *rotationMatrix)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = atan2f(rotationMatrix[1],*rotationMatrix);
  fVar2 = cosf(fVar1);
  fVar3 = sinf(fVar1);
  outRotationAngles[2] = fVar1;
  fVar1 = atan2f(-rotationMatrix[2],*rotationMatrix * fVar2 + rotationMatrix[1] * fVar3);
  outRotationAngles[1] = fVar1;
  fVar1 = atan2f(rotationMatrix[8] * fVar3 - rotationMatrix[9] * fVar2,
                 fVar2 * rotationMatrix[5] - fVar3 * rotationMatrix[4]);
  *outRotationAngles = fVar1;
  return;
}

Assistant:

ndicapiExport void ndiAnglesFromMatrixf(float outRotationAngles[3], const float rotationMatrix[16])
{
  float yaw, cosYaw, sinYaw;

  yaw = atan2f(rotationMatrix[1], rotationMatrix[0]);
  cosYaw = cosf(yaw);
  sinYaw = sinf(yaw);

  outRotationAngles[2] = (float)yaw;
  outRotationAngles[1] = (float)atan2f(-rotationMatrix[2], (cosYaw * rotationMatrix[0]) + (sinYaw * rotationMatrix[1]));
  outRotationAngles[0] = (float)atan2f((sinYaw * rotationMatrix[8]) - (cosYaw * rotationMatrix[9]), (-sinYaw * rotationMatrix[4]) + (cosYaw * rotationMatrix[5]));
}